

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

int mp_compare_uint(char *data_a,char *data_b)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  bVar1 = *data_a;
  uVar6 = (ulong)bVar1;
  bVar2 = *data_b;
  uVar7 = (ulong)bVar2;
  if (bVar1 == bVar2) {
    switch(bVar1) {
    case 0xcc:
      uVar6 = (ulong)(byte)data_a[1];
switchD_0013b334_caseD_cc:
      uVar7 = (ulong)(byte)data_b[1];
      break;
    case 0xcd:
      uVar6 = (ulong)(ushort)(*(ushort *)(data_a + 1) << 8 | *(ushort *)(data_a + 1) >> 8);
switchD_0013b334_caseD_cd:
      uVar7 = (ulong)(ushort)(*(ushort *)(data_b + 1) << 8 | *(ushort *)(data_b + 1) >> 8);
      break;
    case 0xce:
      uVar5 = *(uint *)(data_a + 1);
      uVar6 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                     uVar5 << 0x18);
switchD_0013b334_caseD_ce:
      uVar5 = *(uint *)(data_b + 1);
      uVar7 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                     uVar5 << 0x18);
      break;
    case 0xcf:
      uVar6 = *(ulong *)(data_a + 1);
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
switchD_0013b334_caseD_cf:
      uVar7 = *(ulong *)(data_b + 1);
      uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      break;
    default:
      return 0;
    }
LAB_0013b35d:
    uVar5 = 0xffffffff;
    if (uVar7 <= uVar6) {
      uVar5 = (uint)(uVar7 < uVar6);
    }
    return uVar5;
  }
  switch(bVar1) {
  case 0xcc:
    uVar6 = (ulong)(byte)data_a[1];
    break;
  case 0xcd:
    uVar6 = (ulong)(ushort)(*(ushort *)(data_a + 1) << 8 | *(ushort *)(data_a + 1) >> 8);
    break;
  case 0xce:
    uVar5 = *(uint *)(data_a + 1);
    uVar6 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
    ;
    break;
  case 0xcf:
    uVar6 = *(ulong *)(data_a + 1);
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    break;
  default:
    if ((char)bVar1 < '\0') {
      mp_compare_uint_cold_2();
      goto LAB_0013b374;
    }
  }
  switch(bVar2) {
  case 0xcc:
    goto switchD_0013b334_caseD_cc;
  case 0xcd:
    goto switchD_0013b334_caseD_cd;
  case 0xce:
    goto switchD_0013b334_caseD_ce;
  case 0xcf:
    goto switchD_0013b334_caseD_cf;
  default:
    if ((char)bVar2 < '\0') {
LAB_0013b374:
      mp_compare_uint_cold_1();
      pbVar8 = *(byte **)data_a;
      bVar1 = *pbVar8;
      *(byte **)data_a = pbVar8 + 1;
      switch(bVar1) {
      case 0xd0:
        uVar5 = (uint)(char)pbVar8[1];
        pbVar8 = pbVar8 + 2;
        break;
      case 0xd1:
        uVar3 = *(ushort *)(pbVar8 + 1);
        *(byte **)data_a = pbVar8 + 3;
        return (int)(short)(uVar3 << 8 | uVar3 >> 8);
      case 0xd2:
        uVar5 = *(uint *)(pbVar8 + 1);
        *(byte **)data_a = pbVar8 + 5;
        return uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      case 0xd3:
        uVar4 = *(undefined8 *)(pbVar8 + 1);
        uVar5 = (uint)(byte)((ulong)uVar4 >> 0x38) | ((uint)((ulong)uVar4 >> 0x20) & 0xff0000) >> 8
                | (uint)((ulong)uVar4 >> 0x18) & 0xff0000 | (uint)((ulong)uVar4 >> 8) & 0xff000000;
        pbVar8 = pbVar8 + 9;
        break;
      default:
        if (0xdf < bVar1) {
          return (int)(char)bVar1;
        }
        mp_decode_int_cold_1();
        return 5;
      }
      *(byte **)data_a = pbVar8;
      return uVar5;
    }
    goto LAB_0013b35d;
  }
}

Assistant:

MP_IMPL int
mp_compare_uint(const char *data_a, const char *data_b)
{
	uint8_t ca = mp_load_u8(&data_a);
	uint8_t cb = mp_load_u8(&data_b);
	uint64_t a, b;
	if (ca != cb) {
		a = mp_decode_uint_data(ca, &data_a);
		b = mp_decode_uint_data(cb, &data_b);
		return a < b ? -1 : a > b;
	}
	switch (ca) {
	case 0xcc:
		a = mp_load_u8(&data_a);
		b = mp_load_u8(&data_b);
		break;
	case 0xcd:
		a = mp_load_u16(&data_a);
		b = mp_load_u16(&data_b);
		break;
	case 0xce:
		a = mp_load_u32(&data_a);
		b = mp_load_u32(&data_b);
		break;
	case 0xcf:
		a = mp_load_u64(&data_a);
		b = mp_load_u64(&data_b);
		break;
	default:
		return 0;
	}
	return a < b ? -1 : a > b;
}